

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger base_newthread(HSQUIRRELVM v)

{
  long lVar1;
  SQObjectPtr *pSVar2;
  HSQUIRRELVM dest;
  long lVar3;
  
  pSVar2 = SQVM::GetAt(v,v->_stackbase + 1);
  lVar1 = ((pSVar2->super_SQObject)._unVal.pClosure)->_function->_stacksize * 2;
  lVar3 = 0xf;
  if (0xf < lVar1) {
    lVar3 = lVar1;
  }
  dest = sq_newthread(v,lVar3 + 2);
  sq_move(dest,v,-2);
  return 1;
}

Assistant:

static SQInteger base_newthread(HSQUIRRELVM v)
{
    SQObjectPtr &func = stack_get(v,2);
    SQInteger stksize = (_closure(func)->_function->_stacksize << 1) +2;
    HSQUIRRELVM newv = sq_newthread(v, (stksize < MIN_STACK_OVERHEAD + 2)? MIN_STACK_OVERHEAD + 2 : stksize);
    sq_move(newv,v,-2);
    return 1;
}